

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O3

IntegralConvertResult
absl::lts_20250127::str_format_internal::FormatConvertImpl
          (string_view v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  
  if (conv.flags_ == kBasic) {
    FormatSinkImpl::Append(sink,v);
    bVar1 = true;
  }
  else {
    bVar1 = FormatSinkImpl::PutPaddedString
                      (sink,v,conv.width_,conv.precision_,(bool)(conv.flags_ & kLeft));
  }
  return (IntegralConvertResult)bVar1;
}

Assistant:

StringConvertResult FormatConvertImpl(string_view v,
                                      const FormatConversionSpecImpl conv,
                                      FormatSinkImpl *sink) {
  return {ConvertStringArg(v, conv, sink)};
}